

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_functional_test.cc
# Opt level: O2

void * db_compact_during_compaction_cancellation(void *args)

{
  fdb_status fVar1;
  fdb_file_handle *dbfile;
  timeval __test_begin;
  fdb_file_handle *local_118;
  timeval local_110;
  fdb_config local_100;
  
  gettimeofday(&local_110,(__timezone_ptr_t)0x0);
  fdb_get_default_config();
  local_100.compaction_cb = cb_cancel_test;
  local_100.compaction_cb_ctx = (void *)0x0;
  local_100.compaction_cb_mask = 0x11;
  fVar1 = fdb_open(&local_118,"compact_test",&local_100);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xcac);
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0xcac,"void *db_compact_during_compaction_cancellation(void *)");
  }
  fVar1 = fdb_compact(local_118,(char *)0x0);
  if (((uint)(fVar1 + ~FDB_RESULT_SB_INIT_FAIL) < 0x2e) &&
     ((0x200004000001U >> ((ulong)(uint)(fVar1 + ~FDB_RESULT_SB_INIT_FAIL) & 0x3f) & 1) != 0)) {
    fdb_close(local_118);
    pthread_exit((void *)0x0);
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
          ,0xcb1);
  __assert_fail("status == FDB_RESULT_SUCCESS || status == FDB_RESULT_COMPACTION_CANCELLATION || status == FDB_RESULT_FAIL_BY_ROLLBACK"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0xcb1,"void *db_compact_during_compaction_cancellation(void *)");
}

Assistant:

void *db_compact_during_compaction_cancellation(void *args)
{

    TEST_INIT();

    fdb_file_handle *dbfile;
    fdb_status status;
    fdb_config config;

    // Open Database File
    config = fdb_get_default_config();
    config.compaction_cb = cb_cancel_test;
    config.compaction_cb_ctx = NULL;
    config.compaction_cb_mask = FDB_CS_BEGIN | FDB_CS_END;

    status = fdb_open(&dbfile, "compact_test", &config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    // compaction thread enters here
    status = fdb_compact(dbfile, NULL);
    TEST_CHK(status == FDB_RESULT_SUCCESS ||
             status == FDB_RESULT_COMPACTION_CANCELLATION ||
             status == FDB_RESULT_FAIL_BY_ROLLBACK);
    fdb_close(dbfile);

    // shutdown
    thread_exit(0);
    return NULL;
}